

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O2

void __thiscall
QPDFObjectHandle::replaceStreamData
          (QPDFObjectHandle *this,shared_ptr<QPDFObjectHandle::StreamDataProvider> *provider,
          QPDFObjectHandle *filter,QPDFObjectHandle *decode_parms)

{
  __shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  QPDFObjectHandle local_38;
  
  as_stream(&local_38,(typed)this);
  std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,
             &provider->
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>);
  ::qpdf::Stream::replaceStreamData
            ((Stream *)&local_38,(shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&_Stack_48,
             filter,decode_parms);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDFObjectHandle::replaceStreamData(
    std::shared_ptr<StreamDataProvider> provider,
    QPDFObjectHandle const& filter,
    QPDFObjectHandle const& decode_parms)
{
    as_stream(error).replaceStreamData(provider, filter, decode_parms);
}